

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

void cleanup_meth(void)

{
  blow_message *pbVar1;
  blow_message *next;
  blow_message *msg;
  blow_method *meth;
  
  for (msg = (blow_message *)(blow_methods + 1); msg != (blow_message *)0x0; msg = msg[2].next) {
    next = (blow_message *)msg[1].act_msg;
    string_free(msg[2].act_msg);
    while (next != (blow_message *)0x0) {
      pbVar1 = next->next;
      string_free(next->act_msg);
      mem_free(next);
      next = pbVar1;
    }
    string_free(msg->act_msg);
  }
  mem_free(blow_methods);
  return;
}

Assistant:

static void cleanup_meth(void)
{
	struct blow_method *meth = &blow_methods[1];

	while (meth) {
		struct blow_message *msg = meth->messages;
		string_free(meth->desc);
		while (msg) {
			struct blow_message *next = msg->next;
			string_free(msg->act_msg);
			mem_free(msg);
			msg = next;
		}
		string_free(meth->name);
		meth = meth->next;
	}
	mem_free(blow_methods);
}